

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall IntrusiveListTest_pop_front_Test::TestBody(IntrusiveListTest_pop_front_Test *this)

{
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *expected_01;
  vector<int,_std::allocator<int>_> *expected_02;
  undefined8 local_68;
  undefined8 uStack_60;
  TestObjectList local_58;
  TestObjectList list;
  
  local_68 = 0x200000001;
  uStack_60 = 0x400000003;
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_68);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::NewList
            (&list,(IntrusiveListTest *)&local_58,data_values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_front(&list);
  local_68 = 0x300000002;
  uStack_60 = CONCAT44(uStack_60._4_4_,4);
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_68,(long)&uStack_60 + 4);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_58,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_front(&list);
  local_68 = 0x400000003;
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_68,&uStack_60);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_58,expected_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_front(&list);
  local_68 = CONCAT44(local_68._4_4_,4);
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_68,(long)&local_68 + 4);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_58,expected_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::pop_front(&list);
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_58,expected_02);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, pop_front) {
  TestObjectList list = NewList({1, 2, 3, 4});

  list.pop_front();
  AssertListEq(list, {2, 3, 4});
  list.pop_front();
  AssertListEq(list, {3, 4});
  list.pop_front();
  AssertListEq(list, {4});
  list.pop_front();
  AssertListEq(list, {});
}